

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDScanner::scanEntityDef(DTDScanner *this,DTDEntityDecl *decl,bool isPEDecl)

{
  ReaderMgr *this_00;
  bool bVar1;
  XMLBuffer *pXVar2;
  XMLBuffer *sysIdToFill;
  XMLCh *pXVar3;
  XMLCh *local_138;
  XMLCh *local_128;
  XMLCh *local_118;
  undefined1 local_b0 [8];
  XMLBufBid bbName;
  bool gotSpaces;
  XMLCh *systemId;
  XMLCh *publicId;
  LastExtEntityInfo lastInfo;
  XMLBufBid bbSysId;
  XMLBufBid bbPubId;
  undefined1 local_38 [8];
  XMLBufBid bbValue;
  bool isPEDecl_local;
  DTDEntityDecl *decl_local;
  DTDScanner *this_local;
  
  bbValue.fMgr._7_1_ = isPEDecl;
  bVar1 = ReaderMgr::lookingAtChar(this->fReaderMgr,L'\'');
  if ((bVar1) || (bVar1 = ReaderMgr::lookingAtChar(this->fReaderMgr,L'\"'), bVar1)) {
    XMLBufBid::XMLBufBid((XMLBufBid *)local_38,this->fBufMgr);
    pXVar2 = XMLBufBid::getBuffer((XMLBufBid *)local_38);
    bVar1 = scanEntityLiteral(this,pXVar2);
    if (bVar1) {
      pXVar3 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
      XMLEntityDecl::setValue(&decl->super_XMLEntityDecl,pXVar3);
    }
    XMLBufBid::~XMLBufBid((XMLBufBid *)local_38);
    return bVar1;
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)&bbSysId.fMgr,this->fBufMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)&lastInfo.colNumber,this->fBufMgr);
  pXVar2 = XMLBufBid::getBuffer((XMLBufBid *)&bbSysId.fMgr);
  sysIdToFill = XMLBufBid::getBuffer((XMLBufBid *)&lastInfo.colNumber);
  bVar1 = scanId(this,pXVar2,sysIdToFill,IDType_External);
  if (bVar1) {
    XMLEntityDecl::setIsExternal(&decl->super_XMLEntityDecl,true);
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&publicId);
    ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,(LastExtEntityInfo *)&publicId);
    local_118 = XMLBufBid::getRawBuffer((XMLBufBid *)&bbSysId.fMgr);
    local_128 = XMLBufBid::getRawBuffer((XMLBufBid *)&lastInfo.colNumber);
    if ((local_118 == (XMLCh *)0x0) || (*local_118 == L'\0')) {
      local_118 = (XMLCh *)0x0;
    }
    XMLEntityDecl::setPublicId(&decl->super_XMLEntityDecl,local_118);
    if ((local_128 == (XMLCh *)0x0) || (*local_128 == L'\0')) {
      local_128 = (XMLCh *)0x0;
    }
    XMLEntityDecl::setSystemId(&decl->super_XMLEntityDecl,local_128);
    if ((publicId == (XMLCh *)0x0) || (*publicId == L'\0')) {
      local_138 = (XMLCh *)0x0;
    }
    else {
      local_138 = publicId;
    }
    XMLEntityDecl::setBaseURI(&decl->super_XMLEntityDecl,local_138);
    bbName.fMgr._7_1_ = checkForPERef(this,false,true);
    if ((bbValue.fMgr._7_1_ & 1) != 0) {
      if (!(bool)bbName.fMgr._7_1_) {
        this_local._7_1_ = true;
        goto LAB_003f800f;
      }
      bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNDATAString);
      if (bVar1) {
        XMLScanner::emitError(this->fScanner,NDATANotValidForPE);
      }
    }
    bVar1 = ReaderMgr::lookingAtChar(this->fReaderMgr,L'>');
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      if ((bbName.fMgr._7_1_ & 1) == 0) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
      }
      bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNDATAString);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedNDATA);
      }
      bVar1 = checkForPERef(this,false,true);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
      }
      XMLBufBid::XMLBufBid((XMLBufBid *)local_b0,this->fBufMgr);
      this_00 = this->fReaderMgr;
      pXVar2 = XMLBufBid::getBuffer((XMLBufBid *)local_b0);
      this_local._7_1_ = ReaderMgr::getName(this_00,pXVar2);
      if (this_local._7_1_) {
        pXVar3 = XMLBufBid::getRawBuffer((XMLBufBid *)local_b0);
        XMLEntityDecl::setNotationName(&decl->super_XMLEntityDecl,pXVar3);
      }
      else {
        XMLScanner::emitError(this->fScanner,ExpectedNotationName);
      }
      XMLBufBid::~XMLBufBid((XMLBufBid *)local_b0);
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_003f800f:
  XMLBufBid::~XMLBufBid((XMLBufBid *)&lastInfo.colNumber);
  XMLBufBid::~XMLBufBid((XMLBufBid *)&bbSysId.fMgr);
  return this_local._7_1_;
}

Assistant:

bool DTDScanner::scanEntityDef(DTDEntityDecl& decl, const bool isPEDecl)
{
    // Its got to be an entity literal
    if (fReaderMgr->lookingAtChar(chSingleQuote)
    ||  fReaderMgr->lookingAtChar(chDoubleQuote))
    {
        // Get a buffer for the literal
        XMLBufBid bbValue(fBufMgr);

        if (!scanEntityLiteral(bbValue.getBuffer()))
            return false;

        // Set it on the entity decl
        decl.setValue(bbValue.getRawBuffer());
        return true;
    }

    //
    //  Its got to be an external entity, so there must be an external id.
    //  Get buffers for them and scan an external id into them.
    //
    XMLBufBid bbPubId(fBufMgr);
    XMLBufBid bbSysId(fBufMgr);
    if (!scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), IDType_External))
        return false;

    decl.setIsExternal(true);
    ReaderMgr::LastExtEntityInfo lastInfo;
    fReaderMgr->getLastExtEntityInfo(lastInfo);

    // Fill in the id fields of the decl with the info we got
    const XMLCh* publicId = bbPubId.getRawBuffer();
    const XMLCh* systemId = bbSysId.getRawBuffer();
    decl.setPublicId((publicId && *publicId) ? publicId : 0);
    decl.setSystemId((systemId && *systemId) ? systemId : 0);
    decl.setBaseURI((lastInfo.systemId && *lastInfo.systemId) ? lastInfo.systemId : 0);

    // If its a PE decl, we are done
    bool gotSpaces = checkForPERef(false, true);
    if (isPEDecl)
    {
        //
        //  Check for a common error here. NDATA is not allowed for PEs
        //  so check for the NDATA string. If found give a nice meaningful
        //  error and continue parsing to eat the NDATA text.
        //
        if (gotSpaces)
        {
            if (fReaderMgr->skippedString(XMLUni::fgNDATAString))
                fScanner->emitError(XMLErrs::NDATANotValidForPE);
        }
         else
        {
            return true;
        }
    }

    // If looking at close angle now, we are done
    if (fReaderMgr->lookingAtChar(chCloseAngle))
        return true;

    // Else we had to have seem the whitespace
    if (!gotSpaces)
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // We now have to see a notation data string
    if (!fReaderMgr->skippedString(XMLUni::fgNDATAString))
        fScanner->emitError(XMLErrs::ExpectedNDATA);

    // Space is required here, but try to go on if not
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedNotationName);
        return false;
    }

    // Set the decl's notation name
    decl.setNotationName(bbName.getRawBuffer());

    return true;
}